

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void libtorrent::stat_file(string *inf,file_status *s,error_code *ec,file_status_flag_t flags)

{
  int iVar1;
  int *piVar2;
  native_path_string f;
  stat ret;
  string local_d8;
  stat64 local_b8;
  
  ec->val_ = 0;
  ec->failed_ = false;
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  convert_to_native(&local_d8,inf);
  memset(&local_b8,0,0x90);
  if ((flags.m_val & 1) == 0) {
    iVar1 = stat64(local_d8._M_dataplus._M_p,&local_b8);
  }
  else {
    iVar1 = lstat64(local_d8._M_dataplus._M_p,&local_b8);
  }
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    ec->val_ = iVar1;
    ec->failed_ = iVar1 != 0;
    ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  }
  else {
    s->file_size = local_b8.st_size;
    s->atime = local_b8.st_atim.tv_sec;
    s->mtime = local_b8.st_mtim.tv_sec;
    s->ctime = local_b8.st_ctim.tv_sec;
    (s->mode).m_val =
         (local_b8.st_mode >> 4 & 4 | (uint)((local_b8.st_mode & 0xf000) == 0x4000)) +
         (uint)((local_b8.st_mode & 0xf000) == 0xa000) * 8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void stat_file(std::string const& inf, file_status* s
		, error_code& ec, file_status_flag_t const flags)
	{
		ec.clear();
		native_path_string f = convert_to_native_path_string(inf);
#ifdef TORRENT_WINDOWS

		WIN32_FILE_ATTRIBUTE_DATA data;
		if (!GetFileAttributesExW(f.c_str(), GetFileExInfoStandard, &data))
		{
			ec.assign(GetLastError(), system_category());
			TORRENT_ASSERT(ec);
			return;
		}

		// Fallback to GetFileInformationByHandle for symlinks
		if (!(flags & dont_follow_links) && (data.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT))
		{
#ifdef TORRENT_WINRT

			CREATEFILE2_EXTENDED_PARAMETERS Extended
			{
				sizeof(CREATEFILE2_EXTENDED_PARAMETERS),
				0, // no file attributes
				FILE_FLAG_BACKUP_SEMANTICS // in order to open a directory, we need the FILE_FLAG_BACKUP_SEMANTICS
			};

			const auto h = CreateFile2(f.c_str(), 0, FILE_SHARE_DELETE | FILE_SHARE_READ
				| FILE_SHARE_WRITE, OPEN_EXISTING, &Extended);

			if (h == INVALID_HANDLE_VALUE)
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				return;
			}

			FILE_BASIC_INFO Basic;
			FILE_STANDARD_INFO Standard;

			if (
				!GetFileInformationByHandleEx(h, FILE_INFO_BY_HANDLE_CLASS::FileBasicInfo, &Basic, sizeof(FILE_BASIC_INFO)) ||
				!GetFileInformationByHandleEx(h, FILE_INFO_BY_HANDLE_CLASS::FileStandardInfo, &Standard, sizeof(FILE_STANDARD_INFO))
			)
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				CloseHandle(h);
				return;
			}
			CloseHandle(h);

			fill_file_status(*s, Standard.EndOfFile, Basic.FileAttributes, Basic.CreationTime, Basic.LastAccessTime, Basic.LastWriteTime);
			return;

#else

			// in order to open a directory, we need the FILE_FLAG_BACKUP_SEMANTICS
			HANDLE h = CreateFileW(f.c_str(), 0, FILE_SHARE_DELETE | FILE_SHARE_READ
				| FILE_SHARE_WRITE, nullptr, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
			if (h == INVALID_HANDLE_VALUE)
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				return;
			}

			BY_HANDLE_FILE_INFORMATION handle_data;
			if (!GetFileInformationByHandle(h, &handle_data))
			{
				ec.assign(GetLastError(), system_category());
				TORRENT_ASSERT(ec);
				CloseHandle(h);
				return;
			}
			CloseHandle(h);

			fill_file_status(*s, handle_data.nFileSizeLow, handle_data.nFileSizeHigh, handle_data.dwFileAttributes, handle_data.ftCreationTime, handle_data.ftLastAccessTime, handle_data.ftLastWriteTime);
			return;

#endif
		}

		fill_file_status(*s, data.nFileSizeLow, data.nFileSizeHigh, data.dwFileAttributes, data.ftCreationTime, data.ftLastAccessTime, data.ftLastWriteTime);

#else

		// posix version

		struct ::stat ret{};
		int retval;
		if (flags & dont_follow_links)
			retval = ::lstat(f.c_str(), &ret);
		else
			retval = ::stat(f.c_str(), &ret);
		if (retval < 0)
		{
			ec.assign(errno, system_category());
			return;
		}

		// make sure the _FILE_OFFSET_BITS define worked
		// on this platform. It's supposed to make file
		// related functions support 64-bit offsets.
		static_assert(sizeof(ret.st_size) >= 8, "64 bit file operations are required");

		s->file_size = ret.st_size;
		s->atime = std::uint64_t(ret.st_atime);
		s->mtime = std::uint64_t(ret.st_mtime);
		s->ctime = std::uint64_t(ret.st_ctime);

		s->mode = (S_ISDIR(ret.st_mode) ? file_status::directory : file_attributes_t{})
			| (S_ISLNK(ret.st_mode) ? file_status::symlink : file_attributes_t{})
			| ((ret.st_mode & S_IXUSR) ? file_status::executable : file_attributes_t{})
		;

#endif // TORRENT_WINDOWS
	}